

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileCollectingErrors
          (DescriptorPool *this,FileDescriptorProto *proto,ErrorCollector *error_collector)

{
  bool bVar1;
  LogMessage *pLVar2;
  pointer pTVar3;
  pointer this_00;
  Tables *pTVar4;
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  *this_01;
  undefined1 local_190 [16];
  FileDescriptor *file;
  DeferredValidation deferred_validation;
  undefined1 local_88 [16];
  LogMessageFatal local_78 [19];
  Voidify local_65 [21];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  ErrorCollector *local_28;
  ErrorCollector *error_collector_local;
  FileDescriptorProto *proto_local;
  DescriptorPool *this_local;
  
  local_65[0x14] = (Voidify)0x0;
  local_28 = error_collector;
  error_collector_local = (ErrorCollector *)proto;
  proto_local = (FileDescriptorProto *)this;
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"fallback_database_ == nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0x126f,local_50._M_len,local_50._M_str);
    local_65[0x14] = (Voidify)0x1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [150])
                               "Cannot call BuildFile on a DescriptorPool that uses a DescriptorDatabase.  You must instead find a way to get your file into the underlying database."
                       );
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar2);
  }
  if (((byte)local_65[0x14] & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  deferred_validation.owned_protos_.
  super__Vector_base<google::protobuf::FileDescriptorProto_*,_std::allocator<google::protobuf::FileDescriptorProto_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  if (this->mutex_ != (Mutex *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_88,"mutex_ == nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0x1273,local_88._0_8_,local_88._8_8_);
    deferred_validation.owned_protos_.
    super__Vector_base<google::protobuf::FileDescriptorProto_*,_std::allocator<google::protobuf::FileDescriptorProto_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
    absl::lts_20240722::log_internal::Voidify::operator&&(local_65,pLVar2);
  }
  if ((deferred_validation.owned_protos_.
       super__Vector_base<google::protobuf::FileDescriptorProto_*,_std::allocator<google::protobuf::FileDescriptorProto_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
  }
  this_01 = &this->tables_;
  pTVar3 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(this_01);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(pTVar3->known_bad_symbols_).
           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  pTVar3 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(this_01);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(pTVar3->known_bad_files_).
           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  this->build_started_ = true;
  DeferredValidation::DeferredValidation((DeferredValidation *)&file,this,local_28);
  pTVar3 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::get(this_01);
  DescriptorBuilder::New
            ((DescriptorBuilder *)local_190,this,pTVar3,(DeferredValidation *)&file,local_28);
  this_00 = std::
            unique_ptr<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
            ::operator->((unique_ptr<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
                          *)local_190);
  pTVar4 = (Tables *)
           DescriptorBuilder::BuildFile(this_00,(FileDescriptorProto *)error_collector_local);
  std::
  unique_ptr<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
                 *)local_190);
  local_190._8_8_ = pTVar4;
  bVar1 = DeferredValidation::Validate((DeferredValidation *)&file);
  if (bVar1) {
    this_local = (DescriptorPool *)local_190._8_8_;
  }
  else {
    this_local = (DescriptorPool *)0x0;
  }
  DeferredValidation::~DeferredValidation((DeferredValidation *)&file);
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileCollectingErrors(
    const FileDescriptorProto& proto, ErrorCollector* error_collector) {
  ABSL_CHECK(fallback_database_ == nullptr)
      << "Cannot call BuildFile on a DescriptorPool that uses a "
         "DescriptorDatabase.  You must instead find a way to get your file "
         "into the underlying database.";
  ABSL_CHECK(mutex_ == nullptr);  // Implied by the above ABSL_CHECK.
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  build_started_ = true;
  DeferredValidation deferred_validation(this, error_collector);
  const FileDescriptor* file =
      DescriptorBuilder::New(this, tables_.get(), deferred_validation,
                             error_collector)
          ->BuildFile(proto);
  if (deferred_validation.Validate()) {
    return file;
  }
  return nullptr;
}